

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.h
# Opt level: O0

Expression __thiscall cnn::FastLSTMBuilder::back(FastLSTMBuilder *this)

{
  int *piVar1;
  const_reference this_00;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar2;
  Expression *in_stack_ffffffffffffffc8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_ffffffffffffffd0;
  
  piVar1 = RNNPointer::operator_cast_to_int_((RNNPointer *)(in_RSI + 8));
  if (*piVar1 == -1) {
    this_00 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
                        (in_stack_ffffffffffffffd0);
  }
  else {
    in_stack_ffffffffffffffc8 = (Expression *)(in_RSI + 0x58);
    piVar1 = RNNPointer::operator_cast_to_int_((RNNPointer *)(in_RSI + 8));
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                  *)in_stack_ffffffffffffffc8,(long)*piVar1);
    this_00 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
                        (in_stack_ffffffffffffffd0);
  }
  expr::Expression::Expression(this_00,in_stack_ffffffffffffffc8);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = in_RDI;
  return EVar2;
}

Assistant:

Expression back() const override { return (cur == -1? h0.back() : h[cur].back()); }